

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTo<ot::commissioner::Address_const,ot::commissioner::EnergyReport>
               (pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport> *value,
               ostream *os)

{
  std::operator<<(os,'(');
  FallbackPrinter::PrintValue<ot::commissioner::Address>(&value->first,os);
  std::operator<<(os,", ");
  FallbackPrinter::PrintValue<ot::commissioner::EnergyReport>(&value->second,os);
  std::operator<<(os,')');
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}